

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O2

void __thiscall
random_tests::fastrandom_tests_deterministic::test_method(fastrandom_tests_deterministic *this)

{
  long lVar1;
  readonly_property65 rVar2;
  readonly_property<bool> rVar3;
  uint64_t uVar4;
  long lVar5;
  duration dVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator pvVar8;
  iterator in_R9;
  assertion_result *paVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  check_type cVar10;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 local_6a8 [16];
  undefined1 *local_698;
  char **local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  assertion_result local_648;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  FastRandomContext ctx;
  undefined1 local_168 [8];
  element_type *local_160;
  shared_count sStack_158;
  char *local_150;
  FastRandomContext ctx2;
  FastRandomContext ctx1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,ZEROS);
  FastRandomContext::FastRandomContext(&ctx1,true);
  FastRandomContext::FastRandomContext(&ctx2,true);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1f;
  file.m_begin = (iterator)&local_200;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_210,msg);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_218 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_6a8._0_8_ = FastRandomContext::rand64(&ctx);
  pvVar8 = local_6a8;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x18;
  local_648._1_7_ = 0x817c4df1d77c85;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (local_168,&local_220,0x1f,1,2,pvVar8,"FastRandomContext().rand<uint64_t>()",&local_648,
             "uint64_t{9330418229102544152u}");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x20;
  file_00.m_begin = (iterator)&local_230;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_240,
             msg_00);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_248 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  uVar4 = RandomMixin<FastRandomContext>::randbits<31>(&ctx.super_RandomMixin<FastRandomContext>);
  pvVar8 = local_6a8;
  local_6a8._0_4_ = (int)uVar4;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x69;
  local_648._1_3_ = 0x24e40c;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_168,&local_250,0x20,1,2,pvVar8,"FastRandomContext().rand<int>()",&local_648,
             "int{618925161}");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x21;
  file_01.m_begin = (iterator)&local_260;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_270,
             msg_01);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_278 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randrange<long>
                 (&ctx.super_RandomMixin<FastRandomContext>,3600000000);
  pvVar8 = local_6a8;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x69;
  local_648._1_3_ = 0x4bc487;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_168,&local_280,0x21,1,2,pvVar8,
             "FastRandomContext().randrange<std::chrono::microseconds>(1h).count()",&local_648,
             "1271170921");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = &DAT_00000022;
  file_02.m_begin = (iterator)&local_290;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a0,
             msg_02);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2a8 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randrange<long>
                 (&ctx.super_RandomMixin<FastRandomContext>,3600000);
  pvVar8 = local_6a8;
  local_648._0_4_ = 0x2ac74e;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_168,&local_2b0,0x22,1,2,pvVar8,
             "FastRandomContext().randrange<std::chrono::milliseconds>(1h).count()",&local_648,
             "2803534");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x24;
  file_03.m_begin = (iterator)&local_2c0;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d0,
             msg_03);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2d8 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_6a8._0_8_ = FastRandomContext::rand64(&ctx);
  pvVar8 = local_6a8;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x66;
  local_648._1_7_ = 0x8d2695759f6563;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (local_168,&local_2e0,0x24,1,2,pvVar8,"FastRandomContext().rand<uint64_t>()",&local_648,
             "uint64_t{10170981140880778086u}");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x25;
  file_04.m_begin = (iterator)&local_2f0;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_300,
             msg_04);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_308 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  uVar4 = RandomMixin<FastRandomContext>::randbits<31>(&ctx.super_RandomMixin<FastRandomContext>);
  pvVar8 = local_6a8;
  local_6a8._0_4_ = (int)uVar4;
  local_648._0_4_ = 0x64ad5b65;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_168,&local_310,0x25,1,2,pvVar8,"FastRandomContext().rand<int>()",&local_648,
             "int{1689082725}");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x26;
  file_05.m_begin = (iterator)&local_320;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_330,
             msg_05);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_338 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randrange<long>
                 (&ctx.super_RandomMixin<FastRandomContext>,3600000000);
  pvVar8 = local_6a8;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x84;
  local_648._1_7_ = 0x92e77a;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_168,&local_340,0x26,1,2,pvVar8,
             "FastRandomContext().randrange<std::chrono::microseconds>(1h).count()",&local_648,
             "2464643716");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x27;
  file_06.m_begin = (iterator)&local_350;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_360,
             msg_06);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_368 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randrange<long>
                 (&ctx.super_RandomMixin<FastRandomContext>,3600000);
  pvVar8 = local_6a8;
  local_648._0_4_ = 0x23480d;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_168,&local_370,0x27,1,2,pvVar8,
             "FastRandomContext().randrange<std::chrono::milliseconds>(1h).count()",&local_648,
             "2312205");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x29;
  file_07.m_begin = (iterator)&local_380;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_390,
             msg_07);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_398 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_6a8._0_8_ = FastRandomContext::rand64(&ctx);
  pvVar8 = local_6a8;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x77;
  local_648._1_7_ = 0x4ef4d2cc5d4fdd;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (local_168,&local_3a0,0x29,1,2,pvVar8,"FastRandomContext().rand<uint64_t>()",&local_648,
             "uint64_t{5689404004456455543u}");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2a;
  file_08.m_begin = (iterator)&local_3b0;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3c0,
             msg_08);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3c8 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  uVar4 = RandomMixin<FastRandomContext>::randbits<31>(&ctx.super_RandomMixin<FastRandomContext>);
  pvVar8 = local_6a8;
  local_6a8._0_4_ = (int)uVar4;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x41;
  local_648._1_3_ = 0x2ed6f7;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_168,&local_3d0,0x2a,1,2,pvVar8,"FastRandomContext().rand<int>()",&local_648,
             "int{785839937}");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2b;
  file_09.m_begin = (iterator)&local_3e0;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3f0,
             msg_09);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3f8 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randrange<long>
                 (&ctx.super_RandomMixin<FastRandomContext>,3600000000);
  pvVar8 = local_6a8;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x14;
  local_648._1_3_ = 0x59398;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_168,&local_400,0x2b,1,2,pvVar8,
             "FastRandomContext().randrange<std::chrono::microseconds>(1h).count()",&local_648,
             "93558804");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2c;
  file_10.m_begin = (iterator)&local_410;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_420,
             msg_10);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_428 = "";
  FastRandomContext::FastRandomContext(&ctx,false);
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randrange<long>
                 (&ctx.super_RandomMixin<FastRandomContext>,3600000);
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x8e;
  local_648._1_3_ = 0x7bc;
  pvVar8 = (iterator)0x2;
  pvVar7 = local_6a8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_168,&local_430,0x2c,1,2,local_6a8,
             "FastRandomContext().randrange<std::chrono::milliseconds>(1h).count()",&local_648,
             "507022");
  ChaCha20::~ChaCha20(&ctx.rng);
  FastRandomContext::FastRandomContext(&ctx,true);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = &DAT_00000032;
  file_11.m_begin = (iterator)&local_440;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_450,
             msg_11);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_458 = "";
  paVar9 = &local_648;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x7;
  local_648._1_3_ = 0;
  lVar5 = RandomMixin<FastRandomContext>::randrange<long>
                    (&ctx.super_RandomMixin<FastRandomContext>,9);
  local_6a8._0_8_ = lVar5 + 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
            (local_168,&local_460,0x32,1,2,paVar9,"7",local_6a8,
             "ctx.rand_uniform_delay(time_point, 9s).time_since_epoch().count()");
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x33;
  file_12.m_begin = (iterator)&local_470;
  msg_12.m_end = (iterator)paVar9;
  msg_12.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_480,
             msg_12);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_488 = "";
  paVar9 = &local_648;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0xfa;
  local_648._1_3_ = 0xffffff;
  dVar6 = RandomMixin<FastRandomContext>::
          rand_uniform_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    (&ctx.super_RandomMixin<FastRandomContext>,(duration)0xfffffffffffffff7);
  local_6a8._0_8_ = dVar6.__r + 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
            (local_168,&local_490,0x33,1,2,paVar9,"-6",local_6a8,
             "ctx.rand_uniform_delay(time_point, -9s).time_since_epoch().count()");
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x34;
  file_13.m_begin = (iterator)&local_4a0;
  msg_13.m_end = (iterator)paVar9;
  msg_13.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4b0,
             msg_13);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_4b8 = "";
  local_648._0_4_ = 1;
  local_6a8._0_8_ = &DAT_00000001;
  pvVar8 = (iterator)0x2;
  paVar9 = &local_648;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
            (local_168,&local_4c0,0x34,1,2,&local_648,"1",local_6a8,
             "ctx.rand_uniform_delay(time_point, 0s).time_since_epoch().count()");
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x35;
  file_14.m_begin = (iterator)&local_4d0;
  msg_14.m_end = (iterator)paVar9;
  msg_14.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4e0,
             msg_14);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_4e8 = "";
  pvVar8 = local_6a8;
  local_6a8._0_8_ = (_func_int **)0x40903df1a0ade0b9;
  local_648._0_8_ =
       RandomMixin<FastRandomContext>::randrange<long>
                 (&ctx.super_RandomMixin<FastRandomContext>,0x7fffffffffffffff);
  local_648._0_8_ = local_648._0_8_ + 1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_168,&local_4f0,0x35,1,2,pvVar8,"4652286523065884857",&local_648,
             "ctx.rand_uniform_delay(time_point, 9223372036854775807s).time_since_epoch().count()");
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x36;
  file_15.m_begin = (iterator)&local_500;
  msg_15.m_end = pvVar8;
  msg_15.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_510,
             msg_15);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_518 = "";
  pvVar8 = local_6a8;
  local_6a8._0_8_ = (_func_int **)0x85ae84f358352b47;
  dVar6 = RandomMixin<FastRandomContext>::
          rand_uniform_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    (&ctx.super_RandomMixin<FastRandomContext>,(duration)0x8000000000000001);
  local_648._0_8_ = dVar6.__r + 1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_168,&local_520,0x36,1,2,pvVar8,"-8813961240025683129",&local_648,
             "ctx.rand_uniform_delay(time_point, -9223372036854775807s).time_since_epoch().count()")
  ;
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x37;
  file_16.m_begin = (iterator)&local_530;
  msg_16.m_end = pvVar8;
  msg_16.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_540,
             msg_16);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_548 = "";
  paVar9 = &local_648;
  local_648._0_4_ = 0x674b;
  dVar6 = RandomMixin<FastRandomContext>::
          rand_uniform_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    (&ctx.super_RandomMixin<FastRandomContext>,(duration)0x7e90);
  local_6a8._0_8_ = dVar6.__r + 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
            (local_168,&local_550,0x37,1,2,paVar9,"26443",local_6a8,
             "ctx.rand_uniform_delay(time_point, 9h).time_since_epoch().count()");
  ChaCha20::~ChaCha20(&ctx.rng);
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x39;
  file_17.m_begin = (iterator)&local_560;
  msg_17.m_end = (iterator)paVar9;
  msg_17.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_570,
             msg_17);
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_578 = "";
  uVar4 = RandomMixin<FastRandomContext>::randbits<32>(&ctx1.super_RandomMixin<FastRandomContext>);
  pvVar8 = local_168;
  local_168._0_4_ = (int)uVar4;
  uVar4 = RandomMixin<FastRandomContext>::randbits<32>(&ctx2.super_RandomMixin<FastRandomContext>);
  pvVar7 = (iterator)0x2;
  local_6a8._0_4_ = (int)uVar4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&ctx,&local_580,0x39,1,2,pvVar8,"ctx1.rand32()",local_6a8,"ctx2.rand32()");
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x3a;
  file_18.m_begin = (iterator)&local_590;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_5a0,
             msg_18);
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_5a8 = "";
  uVar4 = RandomMixin<FastRandomContext>::randbits<32>(&ctx1.super_RandomMixin<FastRandomContext>);
  pvVar8 = local_168;
  local_168._0_4_ = (int)uVar4;
  uVar4 = RandomMixin<FastRandomContext>::randbits<32>(&ctx2.super_RandomMixin<FastRandomContext>);
  local_6a8._0_4_ = (int)uVar4;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&ctx,&local_5b0,0x3a,1,2,pvVar8,"ctx1.rand32()",local_6a8,"ctx2.rand32()");
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x3b;
  file_19.m_begin = (iterator)&local_5c0;
  msg_19.m_end = pvVar8;
  msg_19.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_5d0,
             msg_19);
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_5d8 = "";
  local_168 = (undefined1  [8])FastRandomContext::rand64(&ctx1);
  pvVar8 = local_168;
  local_6a8._0_8_ = FastRandomContext::rand64(&ctx2);
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&ctx,&local_5e0,0x3b,1,2,pvVar8,"ctx1.rand64()",local_6a8,"ctx2.rand64()");
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x3c;
  file_20.m_begin = (iterator)&local_5f0;
  msg_20.m_end = pvVar8;
  msg_20.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_600,
             msg_20);
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_608 = "";
  local_168 = (undefined1  [8])
              RandomMixin<FastRandomContext>::randbits(&ctx1.super_RandomMixin<FastRandomContext>,3)
  ;
  pvVar8 = local_168;
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randbits(&ctx2.super_RandomMixin<FastRandomContext>,3);
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&ctx,&local_610,0x3c,1,2,pvVar8,"ctx1.randbits(3)",local_6a8,"ctx2.randbits(3)");
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x3d;
  file_21.m_begin = (iterator)&local_620;
  msg_21.m_end = pvVar8;
  msg_21.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_630,
             msg_21);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,
             &ctx1.super_RandomMixin<FastRandomContext>,0x11);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648,
             &ctx2.super_RandomMixin<FastRandomContext>,0x11);
  _cVar10 = 0x44b110;
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648);
  local_168[0] = rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_658 = "ctx1.randbytes(17) == ctx2.randbytes(17)";
  local_650 = "";
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_660 = "";
  pvVar8 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ctx.rng.m_aligned.input._8_8_ = &local_658;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx,1,0,WARN,_cVar10,(size_t)&local_668,
             0x3d);
  boost::detail::shared_count::~shared_count(&sStack_158);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8);
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x3e;
  file_22.m_begin = (iterator)&local_678;
  msg_22.m_end = pvVar7;
  msg_22.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_688,
             msg_22);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)&ctx,&ctx1.super_RandomMixin<FastRandomContext>);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)local_168,&ctx2.super_RandomMixin<FastRandomContext>);
  _cVar10 = 0x44b234;
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)::operator==((base_blob<256U> *)&ctx,(base_blob<256U> *)local_168);
  local_648.m_message.px = (element_type *)0x0;
  local_648.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_658 = "ctx1.rand256() == ctx2.rand256()";
  local_650 = "";
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_6b0 = "";
  pvVar8 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_690 = &local_658;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_648,(lazy_ostream *)local_6a8,1,0,WARN,_cVar10,(size_t)&local_6b8,0x3e);
  boost::detail::shared_count::~shared_count(&local_648.m_message.pn);
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x3f;
  file_23.m_begin = (iterator)&local_6c8;
  msg_23.m_end = pvVar7;
  msg_23.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_6d8,
             msg_23);
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_6e0 = "";
  local_168 = (undefined1  [8])
              RandomMixin<FastRandomContext>::randbits(&ctx1.super_RandomMixin<FastRandomContext>,7)
  ;
  pvVar8 = local_168;
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randbits(&ctx2.super_RandomMixin<FastRandomContext>,7);
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&ctx,&local_6e8,0x3f,1,2,pvVar8,"ctx1.randbits(7)",(lazy_ostream *)local_6a8,
             "ctx2.randbits(7)");
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_6f0 = "";
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x40;
  file_24.m_begin = (iterator)&local_6f8;
  msg_24.m_end = pvVar8;
  msg_24.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_708,
             msg_24);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,
             &ctx1.super_RandomMixin<FastRandomContext>,0x80);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648,
             &ctx2.super_RandomMixin<FastRandomContext>,0x80);
  _cVar10 = 0x44b432;
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648);
  local_168[0] = rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_658 = "ctx1.randbytes(128) == ctx2.randbytes(128)";
  local_650 = "";
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_718 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_710 = "";
  pvVar8 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ctx.rng.m_aligned.input._8_8_ = &local_658;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx,1,0,WARN,_cVar10,(size_t)&local_718,
             0x40);
  boost::detail::shared_count::~shared_count(&sStack_158);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8);
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x41;
  file_25.m_begin = (iterator)&local_728;
  msg_25.m_end = pvVar7;
  msg_25.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_738,
             msg_25);
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_740 = "";
  uVar4 = RandomMixin<FastRandomContext>::randbits<32>(&ctx1.super_RandomMixin<FastRandomContext>);
  pvVar8 = local_168;
  local_168._0_4_ = (int)uVar4;
  uVar4 = RandomMixin<FastRandomContext>::randbits<32>(&ctx2.super_RandomMixin<FastRandomContext>);
  local_6a8._0_4_ = (int)uVar4;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&ctx,&local_748,0x41,1,2,pvVar8,"ctx1.rand32()",
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,
             "ctx2.rand32()");
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x42;
  file_26.m_begin = (iterator)&local_758;
  msg_26.m_end = pvVar8;
  msg_26.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_768,
             msg_26);
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_778 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_770 = "";
  local_168 = (undefined1  [8])
              RandomMixin<FastRandomContext>::randbits(&ctx1.super_RandomMixin<FastRandomContext>,3)
  ;
  pvVar8 = local_168;
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randbits(&ctx2.super_RandomMixin<FastRandomContext>,3);
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&ctx,&local_778,0x42,1,2,pvVar8,"ctx1.randbits(3)",local_6a8,"ctx2.randbits(3)");
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x43;
  file_27.m_begin = (iterator)&local_788;
  msg_27.m_end = pvVar8;
  msg_27.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_798,
             msg_27);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)&ctx,&ctx1.super_RandomMixin<FastRandomContext>);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)local_168,&ctx2.super_RandomMixin<FastRandomContext>);
  _cVar10 = 0x44b70e;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::operator==((base_blob<256U> *)&ctx,(base_blob<256U> *)local_168);
  local_648.m_message.px = (element_type *)0x0;
  local_648.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_658 = "ctx1.rand256() == ctx2.rand256()";
  local_650 = "";
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_7a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_7a0 = "";
  pvVar8 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_690 = &local_658;
  boost::test_tools::tt_detail::report_assertion
            (&local_648,(lazy_ostream *)local_6a8,1,0,WARN,_cVar10,(size_t)&local_7a8,0x43);
  boost::detail::shared_count::~shared_count(&local_648.m_message.pn);
  local_7b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x44;
  file_28.m_begin = (iterator)&local_7b8;
  msg_28.m_end = pvVar7;
  msg_28.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_7c8,
             msg_28);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,
             &ctx1.super_RandomMixin<FastRandomContext>,0x32);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648,
             &ctx2.super_RandomMixin<FastRandomContext>,0x32);
  _cVar10 = 0x44b810;
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648);
  local_168[0] = rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_658 = "ctx1.randbytes(50) == ctx2.randbytes(50)";
  local_650 = "";
  ctx.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_7d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_7d0 = "";
  pvVar8 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  ctx.rng.m_aligned.input._8_8_ = &local_658;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx,1,0,WARN,_cVar10,(size_t)&local_7d8,
             0x44);
  boost::detail::shared_count::~shared_count(&sStack_158);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8);
  FastRandomContext::FastRandomContext(&ctx,true);
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x4b;
  file_29.m_begin = (iterator)&local_7e8;
  msg_29.m_end = pvVar7;
  msg_29.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_7f8,
             msg_29);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_808 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_800 = "";
  paVar9 = &local_648;
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x76;
  local_648._1_3_ = 0xb8;
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::randrange<long>
                 (&ctx.super_RandomMixin<FastRandomContext>,1000000);
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
            (local_168,&local_808,0x4b,1,2,paVar9,"47222",
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,
             "ctx.rand_uniform_duration<MicroClock>(1s).count()");
  local_818 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x4d;
  file_30.m_begin = (iterator)&local_818;
  msg_30.m_end = (iterator)paVar9;
  msg_30.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_828,
             msg_30);
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_838 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_830 = "";
  local_648._0_4_ = 0xade;
  local_6a8._0_8_ =
       RandomMixin<FastRandomContext>::
       rand_uniform_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                 (&ctx.super_RandomMixin<FastRandomContext>,(duration)0x7e90);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
            (local_168,&local_838,0x4d,1,2,&local_648,"2782",
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,
             "ctx.rand_uniform_duration<SteadySeconds>(9h).count()");
  ChaCha20::~ChaCha20(&ctx.rng);
  ChaCha20::~ChaCha20(&ctx2.rng);
  ChaCha20::~ChaCha20(&ctx1.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fastrandom_tests_deterministic)
{
    // Check that deterministic FastRandomContexts are deterministic
    SeedRandomForTest(SeedRand::ZEROS);
    FastRandomContext ctx1{true};
    FastRandomContext ctx2{true};

    {
        BOOST_CHECK_EQUAL(FastRandomContext().rand<uint64_t>(), uint64_t{9330418229102544152u});
        BOOST_CHECK_EQUAL(FastRandomContext().rand<int>(), int{618925161});
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::microseconds>(1h).count(), 1271170921);
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count(), 2803534);

        BOOST_CHECK_EQUAL(FastRandomContext().rand<uint64_t>(), uint64_t{10170981140880778086u});
        BOOST_CHECK_EQUAL(FastRandomContext().rand<int>(), int{1689082725});
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::microseconds>(1h).count(), 2464643716);
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count(), 2312205);

        BOOST_CHECK_EQUAL(FastRandomContext().rand<uint64_t>(), uint64_t{5689404004456455543u});
        BOOST_CHECK_EQUAL(FastRandomContext().rand<int>(), int{785839937});
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::microseconds>(1h).count(), 93558804);
        BOOST_CHECK_EQUAL(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count(), 507022);
    }

    {
        constexpr SteadySeconds time_point{1s};
        FastRandomContext ctx{true};
        BOOST_CHECK_EQUAL(7, ctx.rand_uniform_delay(time_point, 9s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(-6, ctx.rand_uniform_delay(time_point, -9s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(1, ctx.rand_uniform_delay(time_point, 0s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(4652286523065884857, ctx.rand_uniform_delay(time_point, 9223372036854775807s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(-8813961240025683129, ctx.rand_uniform_delay(time_point, -9223372036854775807s).time_since_epoch().count());
        BOOST_CHECK_EQUAL(26443, ctx.rand_uniform_delay(time_point, 9h).time_since_epoch().count());
    }
    BOOST_CHECK_EQUAL(ctx1.rand32(), ctx2.rand32());
    BOOST_CHECK_EQUAL(ctx1.rand32(), ctx2.rand32());
    BOOST_CHECK_EQUAL(ctx1.rand64(), ctx2.rand64());
    BOOST_CHECK_EQUAL(ctx1.randbits(3), ctx2.randbits(3));
    BOOST_CHECK(ctx1.randbytes(17) == ctx2.randbytes(17));
    BOOST_CHECK(ctx1.rand256() == ctx2.rand256());
    BOOST_CHECK_EQUAL(ctx1.randbits(7), ctx2.randbits(7));
    BOOST_CHECK(ctx1.randbytes(128) == ctx2.randbytes(128));
    BOOST_CHECK_EQUAL(ctx1.rand32(), ctx2.rand32());
    BOOST_CHECK_EQUAL(ctx1.randbits(3), ctx2.randbits(3));
    BOOST_CHECK(ctx1.rand256() == ctx2.rand256());
    BOOST_CHECK(ctx1.randbytes(50) == ctx2.randbytes(50));
    {
        struct MicroClock {
            using duration = std::chrono::microseconds;
        };
        FastRandomContext ctx{true};
        // Check with clock type
        BOOST_CHECK_EQUAL(47222, ctx.rand_uniform_duration<MicroClock>(1s).count());
        // Check with time-point type
        BOOST_CHECK_EQUAL(2782, ctx.rand_uniform_duration<SteadySeconds>(9h).count());
    }
}